

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::~BasicReporter(BasicReporter *this)

{
  undefined8 *in_RDI;
  vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>
  *unaff_retaddr;
  
  *in_RDI = &PTR__BasicReporter_001ef000;
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  ~vector(unaff_retaddr);
  SpanInfo::~SpanInfo((SpanInfo *)0x17757b);
  SpanInfo::~SpanInfo((SpanInfo *)0x177589);
  SpanInfo::~SpanInfo((SpanInfo *)0x177597);
  ReporterConfig::~ReporterConfig((ReporterConfig *)0x1775a5);
  SharedImpl<Catch::IReporter>::~SharedImpl((SharedImpl<Catch::IReporter> *)0x1775af);
  return;
}

Assistant:

BasicReporter::~BasicReporter() {}